

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::replace_trackers
          (torrent *this,
          vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          *urls)

{
  byte bVar1;
  uint uVar2;
  node_ptr plVar3;
  int iVar4;
  undefined4 extraout_var;
  unique_lock<std::mutex> local_38;
  
  tracker_list::replace(&this->m_trackers,urls);
  iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  local_38._M_device = (mutex_type *)(CONCAT44(extraout_var,iVar4) + 0x438);
  local_38._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  uVar2 = *(uint *)(CONCAT44(extraout_var,iVar4) + 0x428);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_38);
  if ((uVar2 >> 0x13 & 1) != 0) {
    tracker_list::prioritize_udp_trackers(&this->m_trackers);
  }
  if (((this->field_0x5c0 & 0x40) != 0) &&
     (plVar3 = (this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node.
               next_,
     plVar3 != &(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node
     && plVar3 != (node_ptr)0x0)) {
    announce_with_tracker(this,none);
  }
  bVar1 = (this->m_need_save_resume_data).m_val;
  if (-1 < (char)bVar1) {
    (this->m_need_save_resume_data).m_val = bVar1 | 0x80;
    state_updated(this);
  }
  return;
}

Assistant:

void torrent::replace_trackers(std::vector<lt::announce_entry> const& urls)
	{
		m_trackers.replace(urls);

		if (settings().get_bool(settings_pack::prefer_udp_trackers))
			m_trackers.prioritize_udp_trackers();

		if (m_announcing && !m_trackers.empty()) announce_with_tracker();

		set_need_save_resume(torrent_handle::if_metadata_changed);
	}